

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::ProcessTRow::operator()
          (ProcessTRow *this,iterator_t *str,iterator_t *end)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 uVar4;
  DecPOMDPDiscrete *pDVar5;
  reference pvVar6;
  ulong uVar7;
  reference puVar8;
  ulong uVar9;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  *in_RSI;
  long *in_RDI;
  Index sucSI;
  iterator jaI_last;
  iterator jaI_it;
  iterator sI_last;
  iterator sI_it;
  Index si;
  Index jaI;
  Index sI;
  stringstream ss_2;
  size_t nrS;
  vector<double,_std::allocator<double>_> row;
  stringstream ss_1;
  stringstream ss;
  stringstream *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  value_type in_stack_fffffffffffff9f4;
  uint in_stack_fffffffffffff9f8;
  uint in_stack_fffffffffffff9fc;
  DecPOMDPDiscrete *in_stack_fffffffffffffa00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa38;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffa40;
  uint local_514;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_508;
  uint *local_500;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_4f8;
  uint local_4ec;
  uint local_4e8;
  value_type local_4e4;
  stringstream local_4e0 [16];
  ostream local_4d0 [376];
  size_type local_358;
  vector<double,_std::allocator<double>_> local_350;
  stringstream local_338 [16];
  ostream local_328 [392];
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100));
  if (sVar2 != 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"ProcessTRow:_m_lp_fromSI has size != 1. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar3 = DPOMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                        (file_position *)in_stack_fffffffffffff9e8);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
         in_stack_fffffffffffff9e8);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  bVar1 = IsRowMatrixLP((ParserDPOMDPFormat_Spirit *)
                        CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0));
  if (bVar1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(*in_RDI + 0x60),0);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
    local_358 = (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                       super_MultiAgentDecisionProcess + 0x30))();
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_350);
    if (sVar2 == local_358) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(*in_RDI + 0x100),0
                         );
      local_4e4 = *pvVar6;
      local_4e8 = 0;
      if (local_4e4 == *(value_type *)(*in_RDI + 0x5c)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xa03f04);
        local_4ec = 0;
        while( true ) {
          uVar9 = (ulong)local_4ec;
          pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
          uVar7 = (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                         super_MultiAgentDecisionProcess + 0x30))();
          if (uVar7 <= uVar9) break;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffffa00,
                     (value_type_conflict1 *)
                     CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
          local_4ec = local_4ec + 1;
        }
      }
      local_4f8._M_current =
           (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              in_stack_fffffffffffff9e8);
      local_500 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     in_stack_fffffffffffff9e8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_fffffffffffff9e8), bVar1) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_4f8);
        local_4e4 = *puVar8;
        local_508._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                in_stack_fffffffffffff9e8);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff9e8)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                  (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)in_stack_fffffffffffff9e8), bVar1) {
          puVar8 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_508);
          local_4e8 = *puVar8;
          for (local_514 = 0; local_514 < local_358; local_514 = local_514 + 1) {
            in_stack_fffffffffffffa00 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
            in_stack_fffffffffffff9f4 = local_4e4;
            in_stack_fffffffffffff9f8 = local_4e8;
            in_stack_fffffffffffff9fc = local_514;
            std::vector<double,_std::allocator<double>_>::operator[](&local_350,(ulong)local_514);
            MultiAgentDecisionProcessDiscrete::SetTransitionProbability
                      (&in_stack_fffffffffffffa00->super_MultiAgentDecisionProcessDiscrete,
                       in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4
                       ,(double)in_stack_fffffffffffff9e8);
          }
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                       in_stack_fffffffffffff9f4);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                     in_stack_fffffffffffff9f4);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa00);
      return;
    }
    std::__cxx11::stringstream::stringstream(local_4e0);
    poVar3 = std::operator<<(local_4d0,"ProcessTRow: exected a row matrix with nrStates=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_358);
    poVar3 = std::operator<<(poVar3," entries. Found ");
    sVar2 = std::vector<double,_std::allocator<double>_>::size(&local_350);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3," entries. (at ");
    boost::spirit::classic::
    position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
    ::get_position(in_RSI);
    poVar3 = DPOMDPFormatParsing::operator<<
                       ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                        (file_position *)in_stack_fffffffffffff9e8);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    uVar4 = __cxa_allocate_exception(0x28);
    E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
         in_stack_fffffffffffff9e8);
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream(local_338);
  std::operator<<(local_328,"ProcessTRow: a row matrix should have been parsed. (at ");
  boost::spirit::classic::
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  ::get_position(in_RSI);
  poVar3 = DPOMDPFormatParsing::operator<<
                     ((ostream *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                      (file_position *)in_stack_fffffffffffff9e8);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  uVar4 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),in_stack_fffffffffffff9e8)
  ;
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

void ParserDPOMDPFormat_Spirit::ProcessTRow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_fromSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessTRow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessTRow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetDecPOMDPDiscrete()->GetNrStates();
    if( row.size() != nrS)
    {
        stringstream ss; ss<<"ProcessTRow: exected a row matrix with nrStates="<<nrS<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }

    Index sI = _m_po->_m_lp_fromSI[0];
    Index jaI = 0;
    if( sI == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_fromSI.clear();
        for(Index si=0; si < _m_po->GetDecPOMDPDiscrete()->GetNrStates();si++)
            _m_po->_m_lp_fromSI.push_back(si);
    }

    vector<Index>::iterator sI_it = _m_po->_m_lp_fromSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_fromSI.end();
    while(sI_it != sI_last)
    {
        sI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            jaI = *jaI_it;
            for(Index sucSI=0; sucSI < nrS; sucSI++)
            {
                _m_po->GetDecPOMDPDiscrete()->SetTransitionProbability
                    (sI, jaI, sucSI, row[sucSI]);
                if(DEBUG_PARSE)
                    cout << "Setting T("<<sI<<","<<jaI<<","<<
                        sucSI<<") = "<<row[sucSI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}